

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_async_legacy_policy::get
          (_async_legacy_policy *this,service *srv)

{
  int iVar1;
  application *paVar2;
  intrusive_ptr<cppcms::application> *in_RSI;
  application *in_RDI;
  service *in_stack_ffffffffffffffc8;
  application *p;
  
  p = in_RDI;
  iVar1 = flags((application_specific_pool *)0x3ac143);
  if (iVar1 == -1) {
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              (in_RSI,p,SUB81((ulong)in_RDI >> 0x38,0));
  }
  else {
    if (in_RSI[3].p_ == (application *)0x0) {
      paVar2 = _policy::get_new((_policy *)in_RDI,in_stack_ffffffffffffffc8);
      in_RSI[3].p_ = paVar2;
    }
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              (in_RSI,p,SUB81((ulong)in_RDI >> 0x38,0));
  }
  return (intrusive_ptr<cppcms::application>)p;
}

Assistant:

virtual booster::intrusive_ptr<application> get(cppcms::service &srv)
	{
		if(self_->flags()==-1)
			return 0;
		if(!app_)
			app_ = get_new(srv);
		return app_;
	}